

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cpp
# Opt level: O0

void __thiscall llvm::MD5::update(MD5 *this,ArrayRef<unsigned_char> Data)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong __n;
  ArrayRef<unsigned_char> AVar4;
  ulong local_48;
  unsigned_long Size;
  uint8_t *Ptr;
  unsigned_long free;
  unsigned_long used;
  MD5_u32plus saved_lo;
  MD5 *this_local;
  ArrayRef<unsigned_char> Data_local;
  
  Data_local.Data = (uchar *)Data.Length;
  this_local = (MD5 *)Data.Data;
  Size = (unsigned_long)ArrayRef<unsigned_char>::data((ArrayRef<unsigned_char> *)&this_local);
  local_48 = ArrayRef<unsigned_char>::size((ArrayRef<unsigned_char> *)&this_local);
  uVar1 = this->lo;
  uVar2 = uVar1 + (int)local_48 & 0x1fffffff;
  this->lo = uVar2;
  if (uVar2 < uVar1) {
    this->hi = this->hi + 1;
  }
  this->hi = this->hi + (int)(local_48 >> 0x1d);
  uVar3 = (ulong)(uVar1 & 0x3f);
  if (uVar3 != 0) {
    __n = 0x40 - uVar3;
    if (local_48 < __n) {
      memcpy(this->buffer + uVar3,(void *)Size,local_48);
      return;
    }
    memcpy(this->buffer + uVar3,(void *)Size,__n);
    Size = Size + __n;
    local_48 = local_48 - __n;
    AVar4 = makeArrayRef<unsigned_char>(this->buffer,0x40);
    body(this,AVar4);
  }
  if (0x3f < local_48) {
    AVar4 = makeArrayRef<unsigned_char>((uchar *)Size,local_48 & 0xffffffffffffffc0);
    Size = (unsigned_long)body(this,AVar4);
    local_48 = local_48 & 0x3f;
  }
  memcpy(this->buffer,(void *)Size,local_48);
  return;
}

Assistant:

void MD5::update(ArrayRef<uint8_t> Data) {
  MD5_u32plus saved_lo;
  unsigned long used, free;
  const uint8_t *Ptr = Data.data();
  unsigned long Size = Data.size();

  saved_lo = lo;
  if ((lo = (saved_lo + Size) & 0x1fffffff) < saved_lo)
    hi++;
  hi += Size >> 29;

  used = saved_lo & 0x3f;

  if (used) {
    free = 64 - used;

    if (Size < free) {
      memcpy(&buffer[used], Ptr, Size);
      return;
    }

    memcpy(&buffer[used], Ptr, free);
    Ptr = Ptr + free;
    Size -= free;
    body(makeArrayRef(buffer, 64));
  }

  if (Size >= 64) {
    Ptr = body(makeArrayRef(Ptr, Size & ~(unsigned long) 0x3f));
    Size &= 0x3f;
  }

  memcpy(buffer, Ptr, Size);
}